

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecSt.c
# Opt level: O1

void Acec_GenerateNpnTable(void)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int Classes [16];
  int Table [256];
  uint local_47c;
  uint auStack_478 [16];
  uint auStack_438 [258];
  
  local_47c = 0;
  do {
    uVar2 = Extra_TruthCanonNPN(local_47c,3);
    lVar3 = (long)(int)local_47c;
    local_47c = local_47c + 1;
    auStack_438[lVar3] = uVar2;
  } while (lVar3 < 0xff);
  local_47c = 0;
  uVar2 = 0;
  do {
    putchar(0x7b);
    Extra_PrintHex(_stdout,auStack_438 + (int)local_47c,3);
    printf(", ");
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        if (auStack_438[(int)local_47c] == auStack_478[uVar4]) goto LAB_0067b414;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      uVar4 = (ulong)uVar2;
    }
LAB_0067b414:
    if ((uint)uVar4 == uVar2) {
      lVar3 = (long)(int)uVar2;
      uVar2 = uVar2 + 1;
      auStack_478[lVar3] = auStack_438[(int)local_47c];
    }
    printf("%2d}, // ");
    Extra_PrintHex(_stdout,&local_47c,3);
    printf(" = %3d\n",(ulong)local_47c);
    bVar1 = 0xfe < (int)local_47c;
    local_47c = local_47c + 1;
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void Acec_GenerateNpnTable()
{
    int Table[256], Classes[16], Map[256];
    int i, k, nClasses = 0;
    for ( i = 0; i < 256; i++ )
        Table[i] = Extra_TruthCanonNPN( i, 3 );
    for ( i = 0; i < 256; i++ )
    {
        printf( "{" );
        Extra_PrintHex( stdout, (unsigned *)&Table[i], 3 );
        printf( ", " );
        // find the class
        for ( k = 0; k < nClasses; k++ )
            if ( Table[i] == Classes[k] )
                break;
        if ( k == nClasses )
            Classes[nClasses++] = Table[i];
        Map[i] = k;
        // print
        printf( "%2d}, // ", k );
        Extra_PrintHex( stdout, (unsigned *)&i, 3 );
        printf( " = %3d\n", i );
    }
}